

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

bool __thiscall PSBTInput::IsNull(PSBTInput *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  bool local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  local_11 = false;
  if (!bVar2) {
    bVar2 = CTxOut::IsNull((CTxOut *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    local_11 = false;
    if (bVar2) {
      bVar2 = std::
              map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              ::empty((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
      local_11 = false;
      if (bVar2) {
        bVar2 = std::
                map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ::empty((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
        local_11 = false;
        if (bVar2) {
          bVar2 = std::
                  map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
                  ::empty((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
                           *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
          local_11 = false;
          if (bVar2) {
            bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                               CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
            local_11 = false;
            if (bVar2) {
              local_11 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                                   ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                    CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_11;
}

Assistant:

bool PSBTInput::IsNull() const
{
    return !non_witness_utxo && witness_utxo.IsNull() && partial_sigs.empty() && unknown.empty() && hd_keypaths.empty() && redeem_script.empty() && witness_script.empty();
}